

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrdrivr.c
# Opt level: O1

FT_Error pfr_get_kerning(FT_Face pfrface,FT_UInt left,FT_UInt right,FT_Vector *avector)

{
  uint uVar1;
  FT_Long FVar2;
  
  pfr_face_get_kerning(pfrface,left,right,avector);
  uVar1 = *(uint *)((long)&pfrface[1].driver + 4);
  if (*(uint *)&pfrface[1].driver != uVar1) {
    if (avector->x != 0) {
      FVar2 = FT_MulDiv(avector->x,(ulong)*(uint *)&pfrface[1].driver,(ulong)uVar1);
      avector->x = FVar2;
    }
    if (avector->y != 0) {
      FVar2 = FT_MulDiv(avector->y,(ulong)*(uint *)&pfrface[1].driver,
                        (ulong)*(uint *)((long)&pfrface[1].driver + 4));
      avector->y = FVar2;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_get_kerning( FT_Face     pfrface,     /* PFR_Face */
                   FT_UInt     left,
                   FT_UInt     right,
                   FT_Vector  *avector )
  {
    PFR_Face     face = (PFR_Face)pfrface;
    PFR_PhyFont  phys = &face->phy_font;


    (void)pfr_face_get_kerning( pfrface, left, right, avector );

    /* convert from metrics to outline units when necessary */
    if ( phys->outline_resolution != phys->metrics_resolution )
    {
      if ( avector->x != 0 )
        avector->x = FT_MulDiv( avector->x,
                                (FT_Long)phys->outline_resolution,
                                (FT_Long)phys->metrics_resolution );

      if ( avector->y != 0 )
        avector->y = FT_MulDiv( avector->y,
                                (FT_Long)phys->outline_resolution,
                                (FT_Long)phys->metrics_resolution );
    }

    return FT_Err_Ok;
  }